

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O1

size_t __thiscall llvm::StringRef::rfind_lower(StringRef *this,StringRef Str)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  ulong Length;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  Length = Str.Length;
  uVar1 = this->Length;
  sVar4 = 0xffffffffffffffff;
  uVar7 = uVar1 - Length;
  sVar5 = sVar4;
  if ((Length <= uVar1) && (uVar7 != 0xffffffffffffffff)) {
    pcVar2 = this->Data;
    do {
      uVar6 = uVar7;
      if (uVar1 < uVar7) {
        uVar6 = uVar1;
      }
    } while (((uVar1 - uVar6 < Length) ||
             (iVar3 = ascii_strncasecmp(pcVar2 + uVar6,Str.Data,Length), sVar5 = uVar7, iVar3 != 0))
            && (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, sVar5 = sVar4, bVar8));
  }
  return sVar5;
}

Assistant:

size_t StringRef::rfind_lower(StringRef Str) const {
  size_t N = Str.size();
  if (N > Length)
    return npos;
  for (size_t i = Length - N + 1, e = 0; i != e;) {
    --i;
    if (substr(i, N).equals_lower(Str))
      return i;
  }
  return npos;
}